

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

InterfaceHandle __thiscall
helics::CommonCore::registerDataSink(CommonCore *this,LocalFederateId federateID,string_view name)

{
  InterfaceHandle handle;
  string_view type;
  string_view type_00;
  string_view units;
  undefined1 auVar1 [16];
  ushort flags;
  FederateState *this_00;
  _Hash_node<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
  *p_Var2;
  size_t size;
  ActionMessage reg;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [10];
  uint16_t local_ce;
  SmallBuffer local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  size = name._M_len;
  this_00 = checkNewInterface(this,federateID,name,SINK);
  flags = (this_00->interfaceFlags).super___atomic_base<unsigned_short>._M_i | 0x4400;
  local_e0._0_4_ = 0;
  local_e0._4_4_ = 0;
  local_d8[0] = 0;
  type._M_str = "sink";
  type._M_len = 4;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_d8;
  local_e8 = local_d8;
  p_Var2 = createBasicHandle(this,(GlobalFederateId)(this_00->global_id)._M_i.gid,
                             (LocalFederateId)(this_00->local_id).fid,SINK,name,type,
                             (string_view)(auVar1 << 0x40),flags);
  if (local_e8 != local_d8) {
    operator_delete(local_e8,CONCAT71(local_d8._1_7_,local_d8[0]) + 1);
  }
  handle.hid = *(BaseType *)((long)&(p_Var2->super__Hash_node_base)._M_nxt + 4);
  type_00._M_str = "sink";
  type_00._M_len = 4;
  units._M_str = gEmptyString_abi_cxx11_;
  units._M_len = DAT_004fb740;
  FederateState::createInterface(this_00,SINK,handle,name,type_00,units,flags);
  ActionMessage::ActionMessage((ActionMessage *)&local_e8,cmd_reg_datasink);
  local_e0._4_4_ = handle.hid;
  local_e0._0_4_ = (this_00->global_id)._M_i.gid;
  local_a8.bufferSize = size;
  if ((local_a8.heap != (byte *)name._M_str) && (SmallBuffer::reserve(&local_a8,size), size != 0)) {
    memcpy(local_a8.heap,name._M_str,size);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(&local_48,1);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,0,
             (local_48.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->_M_string_length,"sink",4);
  local_ce = *(uint16_t *)
              ((long)&(p_Var2->
                      super__Hash_node_value<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
                      ).
                      super__Hash_node_value_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>
                      ._M_storage._M_storage + 6);
  gmlc::containers::
  BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
  push<helics::ActionMessage>(&(this->super_BrokerBase).actionQueue,(ActionMessage *)&local_e8);
  ActionMessage::~ActionMessage((ActionMessage *)&local_e8);
  return (InterfaceHandle)handle.hid;
}

Assistant:

InterfaceHandle CommonCore::registerDataSink(LocalFederateId federateID, std::string_view name)
{
    auto* fed = checkNewInterface(federateID, name, InterfaceType::SINK);
    const uint16_t sinkFlags =
        fed->getInterfaceFlags() | make_flags(receive_only_flag, targeted_flag);

    const auto& handle = createBasicHandle(
        fed->global_id, fed->local_id, InterfaceType::SINK, name, "sink", std::string{}, sinkFlags);

    auto hid = handle.getInterfaceHandle();
    fed->createInterface(InterfaceType::SINK, hid, name, "sink", gEmptyString, sinkFlags);
    ActionMessage reg(CMD_REG_DATASINK);
    reg.source_id = fed->global_id.load();
    reg.source_handle = hid;
    reg.name(name);
    reg.setStringData("sink");
    reg.flags = handle.flags;
    actionQueue.push(std::move(reg));

    return hid;
}